

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chatclient.cpp
# Opt level: O3

void __thiscall ChatClient::ChatClient(ChatClient *this,QObject *parent)

{
  QTcpSocket *pQVar1;
  undefined4 *puVar2;
  code *local_78;
  undefined8 local_70;
  code *local_68;
  ImplFn local_60;
  QObject local_58 [8];
  QObject local_50 [8];
  QObject local_48 [8];
  QObject local_40 [8];
  QObject local_38 [8];
  
  QObject::QObject(&this->super_QObject,parent);
  *(undefined ***)this = &PTR_metaObject_0010d9c0;
  pQVar1 = (QTcpSocket *)operator_new(0x10);
  QTcpSocket::QTcpSocket(pQVar1,&this->super_QObject);
  this->m_clientSocket = pQVar1;
  this->m_loggedIn = false;
  local_78 = QAbstractSocket::connected;
  local_70 = 0;
  local_68 = connected;
  local_60 = (ImplFn)0x0;
  puVar2 = (undefined4 *)operator_new(0x20);
  *puVar2 = 1;
  *(code **)(puVar2 + 2) =
       QtPrivate::QSlotObject<void_(ChatClient::*)(),_QtPrivate::List<>,_void>::impl;
  *(code **)(puVar2 + 4) = connected;
  *(undefined8 *)(puVar2 + 6) = 0;
  QObject::connectImpl
            (local_38,(void **)pQVar1,(QObject *)&local_78,(void **)this,
             (QSlotObjectBase *)&local_68,(ConnectionType)puVar2,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_38);
  pQVar1 = this->m_clientSocket;
  local_78 = QAbstractSocket::disconnected;
  local_70 = 0;
  local_68 = disconnected;
  local_60 = (ImplFn)0x0;
  puVar2 = (undefined4 *)operator_new(0x20);
  *puVar2 = 1;
  *(code **)(puVar2 + 2) =
       QtPrivate::QSlotObject<void_(ChatClient::*)(),_QtPrivate::List<>,_void>::impl;
  *(code **)(puVar2 + 4) = disconnected;
  *(undefined8 *)(puVar2 + 6) = 0;
  QObject::connectImpl
            (local_40,(void **)pQVar1,(QObject *)&local_78,(void **)this,
             (QSlotObjectBase *)&local_68,(ConnectionType)puVar2,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_40);
  pQVar1 = this->m_clientSocket;
  local_78 = QIODevice::readyRead;
  local_70 = 0;
  local_68 = onReadyRead;
  local_60 = (ImplFn)0x0;
  puVar2 = (undefined4 *)operator_new(0x20);
  *puVar2 = 1;
  *(code **)(puVar2 + 2) =
       QtPrivate::QSlotObject<void_(ChatClient::*)(),_QtPrivate::List<>,_void>::impl;
  *(code **)(puVar2 + 4) = onReadyRead;
  *(undefined8 *)(puVar2 + 6) = 0;
  QObject::connectImpl
            (local_48,(void **)pQVar1,(QObject *)&local_78,(void **)this,
             (QSlotObjectBase *)&local_68,(ConnectionType)puVar2,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_48);
  pQVar1 = this->m_clientSocket;
  local_78 = QAbstractSocket::errorOccurred;
  local_70 = 0;
  local_68 = error;
  local_60 = (ImplFn)0x0;
  puVar2 = (undefined4 *)operator_new(0x20);
  *puVar2 = 1;
  *(code **)(puVar2 + 2) =
       QtPrivate::
       QSlotObject<void_(ChatClient::*)(QAbstractSocket::SocketError),_QtPrivate::List<QAbstractSocket::SocketError>,_void>
       ::impl;
  *(code **)(puVar2 + 4) = error;
  *(undefined8 *)(puVar2 + 6) = 0;
  QObject::connectImpl
            (local_50,(void **)pQVar1,(QObject *)&local_78,(void **)this,
             (QSlotObjectBase *)&local_68,(ConnectionType)puVar2,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_50);
  pQVar1 = this->m_clientSocket;
  local_78 = QAbstractSocket::disconnected;
  local_70 = 0;
  puVar2 = (undefined4 *)operator_new(0x18);
  *puVar2 = 1;
  *(code **)(puVar2 + 2) =
       QtPrivate::
       QFunctorSlotObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]ChatExample/QtSimpleChatClient/chatclient.cpp:26:62),_0,_QtPrivate::List<>,_void>
       ::impl;
  *(ChatClient **)(puVar2 + 4) = this;
  QObject::connectImpl
            (local_58,(void **)pQVar1,(QObject *)&local_78,(void **)this,(QSlotObjectBase *)0x0,
             (ConnectionType)puVar2,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_58);
  return;
}

Assistant:

ChatClient::ChatClient(QObject *parent)
    : QObject(parent)
    , m_clientSocket(new QTcpSocket(this))
    , m_loggedIn(false)
{
    // Forward the connected and disconnected signals
    connect(m_clientSocket, &QTcpSocket::connected, this, &ChatClient::connected);
    connect(m_clientSocket, &QTcpSocket::disconnected, this, &ChatClient::disconnected);
    // connect readyRead() to the slot that will take care of reading the data in
    connect(m_clientSocket, &QTcpSocket::readyRead, this, &ChatClient::onReadyRead);
    // Forward the error signal, QOverload is necessary as error() is overloaded, see the Qt docs 
#if (QT_VERSION < QT_VERSION_CHECK(6, 0, 0))
    connect(m_clientSocket, QOverload<QAbstractSocket::SocketError>::of(&QAbstractSocket::error), this, &ChatClient::error);
#else
    connect(m_clientSocket, &QAbstractSocket::errorOccurred, this, &ChatClient::error);
#endif
    // Reset the m_loggedIn variable when we disconnec. Since the operation is trivial we use a lambda instead of creating another slot
    connect(m_clientSocket, &QTcpSocket::disconnected, this, [this]()->void{m_loggedIn = false;});
}